

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::MILSpec::Dimension_ConstantDimension::~Dimension_ConstantDimension
          (Dimension_ConstantDimension *this)

{
  ~Dimension_ConstantDimension(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

Dimension_ConstantDimension::~Dimension_ConstantDimension() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.MILSpec.Dimension.ConstantDimension)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}